

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall
Rml::Context::ProcessMouseWheel(Context *this,Vector2f wheel_delta,int key_modifier_state)

{
  ScrollController *pSVar1;
  Vector2f delta_distance;
  Vector2f delta_distance_00;
  bool bVar2;
  type pVVar3;
  Element *in_target;
  Context *this_00;
  float fVar4;
  float fVar5;
  Vector2f wheel_delta_local;
  Dictionary scroll_parameters;
  
  pSVar1 = (this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  wheel_delta_local = wheel_delta;
  if (pSVar1->mode == Autoscroll) {
    ScrollController::Reset(pSVar1);
    bVar2 = false;
  }
  else if (this->hover == (Element *)0x0) {
    ScrollController::Reset(pSVar1);
    bVar2 = true;
  }
  else {
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this;
    GenerateMouseEventParameters(this,&scroll_parameters,-1);
    GenerateKeyModifierEventParameters(this_00,&scroll_parameters,key_modifier_state);
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[14]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&scroll_parameters,(char (*) [14])"wheel_delta_x");
    Variant::operator=(pVVar3,&wheel_delta_local.x);
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[14]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&scroll_parameters,(char (*) [14])"wheel_delta_y");
    Variant::operator=(pVVar3,&wheel_delta_local.y);
    bVar2 = Element::DispatchEvent(this->hover,Mousescroll,&scroll_parameters);
    if (bVar2) {
      fVar4 = this->density_independent_pixel_ratio * 80.0;
      fVar5 = wheel_delta_local.x * fVar4;
      fVar4 = fVar4 * wheel_delta_local.y;
      in_target = Element::GetClosestScrollableContainer(this->hover);
      pSVar1 = (this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
      if ((pSVar1->mode == Smoothscroll) && (pSVar1->target == in_target)) {
        delta_distance.y = fVar4;
        delta_distance.x = fVar5;
        ScrollController::IncrementSmoothscrollTarget(pSVar1,delta_distance);
      }
      else {
        delta_distance_00.y = fVar4;
        delta_distance_00.x = fVar5;
        ScrollController::ActivateSmoothscroll(pSVar1,in_target,delta_distance_00,Auto);
      }
      bVar2 = in_target == (Element *)0x0;
    }
    else {
      bVar2 = false;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&scroll_parameters.m_container);
  }
  return bVar2;
}

Assistant:

bool Context::ProcessMouseWheel(Vector2f wheel_delta, int key_modifier_state)
{
	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
		return false;
	}
	else if (!hover)
	{
		scroll_controller->Reset();
		return true;
	}

	Dictionary scroll_parameters;
	GenerateMouseEventParameters(scroll_parameters);
	GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
	scroll_parameters["wheel_delta_x"] = wheel_delta.x;
	scroll_parameters["wheel_delta_y"] = wheel_delta.y;

	// Dispatch a mouse scroll event, this gives elements an opportunity to block scrolling from being performed.
	if (!hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
		return false;

	const float unit_scroll_length = UNIT_SCROLL_LENGTH * density_independent_pixel_ratio;
	const Vector2f scroll_length = wheel_delta * unit_scroll_length;
	Element* target = hover->GetClosestScrollableContainer();

	if (scroll_controller->GetMode() == ScrollController::Mode::Smoothscroll && scroll_controller->GetTarget() == target)
		scroll_controller->IncrementSmoothscrollTarget(scroll_length);
	else
		scroll_controller->ActivateSmoothscroll(target, scroll_length, ScrollBehavior::Auto);

	return target == nullptr;
}